

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall
duckdb::ART::Erase(ART *this,Node *node,reference<const_ARTKey> key,idx_t depth,
                  reference<const_ARTKey> row_id,GateStatus status)

{
  byte bVar1;
  bool bVar2;
  optional_idx oVar3;
  ulong uVar4;
  unsafe_optional_ptr<Node> node_00;
  uint8_t byte;
  IndexPointer child;
  ulong uVar5;
  idx_t depth_local;
  reference<Node> next;
  reference<Node> ref;
  idx_t temp_depth;
  
  uVar4 = (node->super_IndexPointer).data;
  if (uVar4 >> 0x38 == 0) {
    return;
  }
  depth_local = depth;
  next._M_data = node;
  if ((uVar4 & 0x7f00000000000000) == 0x100000000000000) {
    oVar3 = Prefix::TraverseMutable(this,&next,key._M_data,&depth_local);
    if (oVar3.index != 0xffffffffffffffff) {
      return;
    }
    uVar4 = ((next._M_data)->super_IndexPointer).data;
  }
  bVar1 = (byte)(uVar4 >> 0x38);
  if ((bVar1 & 0x7f) == 2) {
    Leaf::TransformToNested(this,next._M_data);
    uVar4 = ((next._M_data)->super_IndexPointer).data;
  }
  else if ((bVar1 & 0x7f) == 7) {
    uVar5 = *(ulong *)(row_id._M_data)->data ^ 0x80;
    if ((uVar4 & 0xffffffffffffff) !=
        (*(ulong *)(row_id._M_data)->data >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
         (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8
         | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38)) {
      return;
    }
    Node::Free(this,node);
    return;
  }
  if ((status == GATE_NOT_SET) && ((long)uVar4 < 0)) {
    Erase(this,next._M_data,row_id,0,row_id,GATE_SET);
    return;
  }
  if ((byte)(((byte)(uVar4 >> 0x38) & 0x7f) - 8) < 3) {
    temp_depth = CONCAT71(temp_depth._1_7_,(key._M_data)->data[depth_local]);
    bVar2 = Node::HasByte(next._M_data,this,(uint8_t *)&temp_depth);
    if (!bVar2) {
      return;
    }
    byte = (key._M_data)->data[depth_local];
  }
  else {
    node_00 = GetChildInternal<duckdb::Node_const>
                        (this,next._M_data,(key._M_data)->data[depth_local]);
    if (node_00.ptr == (Node *)0x0) {
      return;
    }
    uVar4 = ((node_00.ptr)->super_IndexPointer).data;
    if ((uVar4 & 0x7f00000000000000) == 0x200000000000000) {
      Leaf::TransformToNested(this,node_00.ptr);
      uVar4 = ((node_00.ptr)->super_IndexPointer).data;
    }
    if ((status == GATE_NOT_SET) && ((long)uVar4 < 0)) {
      Erase(this,node_00.ptr,row_id,0,row_id,GATE_SET);
      child.data = ((node_00.ptr)->super_IndexPointer).data;
      byte = (key._M_data)->data[depth_local];
      if (0xffffffffffffff < child.data) {
LAB_01a1cf3d:
        Node::ReplaceChild(next._M_data,this,byte,(Node)child.data);
        return;
      }
      status = GATE_NOT_SET;
    }
    else {
      temp_depth = depth_local + 1;
      ref._M_data = (Node *)node_00;
      if ((uVar4 & 0x7f00000000000000) == 0x100000000000000) {
        oVar3 = Prefix::TraverseMutable(this,&ref,key._M_data,&temp_depth);
        if (oVar3.index != 0xffffffffffffffff) {
          return;
        }
        uVar4 = ((ref._M_data)->super_IndexPointer).data;
      }
      if ((uVar4 & 0x7f00000000000000) == 0x700000000000000) {
        uVar5 = *(ulong *)(row_id._M_data)->data ^ 0x80;
        if ((uVar4 & 0xffffffffffffff) !=
            (*(ulong *)(row_id._M_data)->data >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
             (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
             (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
            uVar5 << 0x38)) {
          return;
        }
        byte = (key._M_data)->data[depth_local];
      }
      else {
        Erase(this,node_00.ptr,key,depth_local + 1,row_id,status);
        child.data = ((node_00.ptr)->super_IndexPointer).data;
        byte = (key._M_data)->data[depth_local];
        if (0xffffffffffffff < child.data) goto LAB_01a1cf3d;
      }
    }
  }
  Node::DeleteChild(this,next._M_data,node,byte,status,key._M_data);
  return;
}

Assistant:

void ART::Erase(Node &node, reference<const ARTKey> key, idx_t depth, reference<const ARTKey> row_id,
                GateStatus status) {
	if (!node.HasMetadata()) {
		return;
	}

	// Traverse the prefix.
	reference<Node> next(node);
	if (next.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::TraverseMutable(*this, next, key, depth);
		if (pos.IsValid()) {
			// Prefixes don't match: nothing to erase.
			return;
		}
	}

	//	Delete the row ID from the leaf.
	//	This is the root node, which can be a leaf with possible prefix nodes.
	if (next.get().GetType() == NType::LEAF_INLINED) {
		if (next.get().GetRowId() == row_id.get().GetRowId()) {
			Node::Free(*this, node);
		}
		return;
	}

	// Transform a deprecated leaf.
	if (next.get().GetType() == NType::LEAF) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		Leaf::TransformToNested(*this, next);
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && next.get().GetGateStatus() == GateStatus::GATE_SET) {
		return Erase(next, row_id, 0, row_id, GateStatus::GATE_SET);
	}

	D_ASSERT(depth < key.get().len);
	if (next.get().IsLeafNode()) {
		auto byte = key.get()[depth];
		if (next.get().HasByte(*this, byte)) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		}
		return;
	}

	auto child = next.get().GetChildMutable(*this, key.get()[depth]);
	if (!child) {
		// No child at the byte: nothing to erase.
		return;
	}

	// Transform a deprecated leaf.
	if (child->GetType() == NType::LEAF) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		Leaf::TransformToNested(*this, *child);
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && child->GetGateStatus() == GateStatus::GATE_SET) {
		Erase(*child, row_id, 0, row_id, GateStatus::GATE_SET);
		if (!child->HasMetadata()) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		} else {
			next.get().ReplaceChild(*this, key.get()[depth], *child);
		}
		return;
	}

	auto temp_depth = depth + 1;
	reference<Node> ref(*child);

	if (ref.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::TraverseMutable(*this, ref, key, temp_depth);
		if (pos.IsValid()) {
			// Prefixes don't match: nothing to erase.
			return;
		}
	}

	if (ref.get().GetType() == NType::LEAF_INLINED) {
		if (ref.get().GetRowId() == row_id.get().GetRowId()) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		}
		return;
	}

	// Recurse.
	Erase(*child, key, depth + 1, row_id, status);
	if (!child->HasMetadata()) {
		Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
	} else {
		next.get().ReplaceChild(*this, key.get()[depth], *child);
	}
}